

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O3

void __thiscall cursespp::Checkbox::SetText(Checkbox *this,string *value)

{
  size_t __n;
  int iVar1;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __n = value->_M_string_length;
  if (__n == (this->originalText)._M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar1 = bcmp((value->_M_dataplus)._M_p,(this->originalText)._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return;
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->originalText);
  __lhs = &UNCHECKED_abi_cxx11_;
  if (this->checked != false) {
    __lhs = &CHECKED_abi_cxx11_;
  }
  std::operator+(&local_38,__lhs,value);
  TextLabel::SetText(&this->super_TextLabel,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Checkbox::SetText(const std::string& value) {
    if (value != this->originalText) {
        this->originalText = value;
        TextLabel::SetText(decorate(value, this->checked));
    }
}